

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void load_buffer_16x16(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  __m128i *palVar1;
  int in_ECX;
  int in_EDX;
  __m128i *in_RSI;
  __m128i *in_RDI;
  int in_R8D;
  int16_t *tmp;
  int16_t *botR;
  int16_t *botL;
  int16_t *topR;
  int16_t *topL;
  __m128i in [64];
  __m128i *in_stack_fffffffffffffbb0;
  __m128i *palVar2;
  __m128i *palVar3;
  __m128i *in_00;
  __m128i *input_00;
  __m128i *local_430;
  longlong local_428 [131];
  __m128i *local_10;
  
  input_00 = in_RDI + 1;
  palVar3 = (__m128i *)((long)*in_RDI + (long)(in_EDX << 3) * 2);
  palVar1 = (__m128i *)((long)in_RDI[1] + (long)(in_EDX << 3) * 2);
  palVar2 = palVar1;
  in_00 = palVar3;
  local_430 = in_RDI;
  if (in_ECX != 0) {
    in_stack_fffffffffffffbb0 = input_00;
    palVar2 = input_00;
    in_00 = in_RDI;
    input_00 = palVar1;
    local_430 = palVar3;
  }
  palVar3 = palVar2;
  if (in_R8D != 0) {
    in_stack_fffffffffffffbb0 = in_00;
    palVar3 = in_00;
    in_00 = palVar2;
    input_00 = local_430;
  }
  local_10 = in_RSI;
  load_buffer_8x8((int16_t *)input_00,in_00,(int)((ulong)palVar3 >> 0x20),(int)palVar3,
                  (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),(int)in_stack_fffffffffffffbb0);
  load_buffer_8x8((int16_t *)input_00,in_00,(int)((ulong)palVar3 >> 0x20),(int)palVar3,
                  (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),(int)in_stack_fffffffffffffbb0);
  load_buffer_8x8((int16_t *)input_00,in_00,(int)((ulong)palVar3 >> 0x20),(int)palVar3,
                  (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),(int)in_stack_fffffffffffffbb0);
  load_buffer_8x8((int16_t *)input_00,in_00,(int)((ulong)palVar3 >> 0x20),(int)palVar3,
                  (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),(int)in_stack_fffffffffffffbb0);
  convert_8x8_to_16x16((__m128i *)local_428,local_10);
  return;
}

Assistant:

static inline void load_buffer_16x16(const int16_t *input, __m128i *out,
                                     int stride, int flipud, int fliplr,
                                     int shift) {
  __m128i in[64];
  // Load 4 8x8 blocks
  const int16_t *topL = input;
  const int16_t *topR = input + 8;
  const int16_t *botL = input + 8 * stride;
  const int16_t *botR = input + 8 * stride + 8;

  const int16_t *tmp;

  if (flipud) {
    // Swap left columns
    tmp = topL;
    topL = botL;
    botL = tmp;
    // Swap right columns
    tmp = topR;
    topR = botR;
    botR = tmp;
  }

  if (fliplr) {
    // Swap top rows
    tmp = topL;
    topL = topR;
    topR = tmp;
    // Swap bottom rows
    tmp = botL;
    botL = botR;
    botR = tmp;
  }

  // load first 8 columns
  load_buffer_8x8(topL, &in[0], stride, flipud, fliplr, shift);
  load_buffer_8x8(botL, &in[32], stride, flipud, fliplr, shift);

  // load second 8 columns
  load_buffer_8x8(topR, &in[16], stride, flipud, fliplr, shift);
  load_buffer_8x8(botR, &in[48], stride, flipud, fliplr, shift);

  convert_8x8_to_16x16(in, out);
}